

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Geometry.cpp
# Opt level: O0

SP __thiscall pbrt::SemanticParser::findOrCreateShape(SemanticParser *this,SP *pbrtShape)

{
  bool bVar1;
  iterator shape;
  element_type *peVar2;
  element_type *peVar3;
  element_type *peVar4;
  size_type sVar5;
  ostream *this_00;
  SemanticParser *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
  *in_RSI;
  element_type *in_RDI;
  SP SVar7;
  vector<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
  *areaLights;
  SP *newShape;
  SP *in_stack_00000120;
  SemanticParser *in_stack_00000128;
  map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
  *in_stack_ffffffffffffff38;
  shared_ptr<pbrt::Shape> *in_stack_ffffffffffffff40;
  shared_ptr<pbrt::AreaLight> *this_01;
  undefined7 in_stack_ffffffffffffff50;
  byte bVar8;
  shared_ptr<pbrt::AreaLight> local_78 [2];
  vector<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
  *local_58;
  undefined1 local_29;
  _Self local_28;
  
  shape = std::
          map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
          ::find(in_stack_ffffffffffffff38,(key_type *)0x1dd592);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
       ::end(in_stack_ffffffffffffff38);
  bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffe0,&local_28);
  if (bVar1) {
    std::
    map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
    ::operator[](in_RSI,(key_type *)in_RDI);
    std::shared_ptr<pbrt::Shape>::shared_ptr
              (in_stack_ffffffffffffff40,(shared_ptr<pbrt::Shape> *)in_stack_ffffffffffffff38);
    _Var6._M_pi = extraout_RDX;
  }
  else {
    local_29 = 0;
    std::shared_ptr<pbrt::syntactic::Shape>::shared_ptr
              ((shared_ptr<pbrt::syntactic::Shape> *)in_stack_ffffffffffffff40,
               (shared_ptr<pbrt::syntactic::Shape> *)in_stack_ffffffffffffff38);
    emitShape(in_RDX,(SP *)shape._M_node);
    std::shared_ptr<pbrt::syntactic::Shape>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::Shape> *)0x1dd638);
    std::
    map<std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>,_std::less<std::shared_ptr<pbrt::syntactic::Shape>_>,_std::allocator<std::pair<const_std::shared_ptr<pbrt::syntactic::Shape>,_std::shared_ptr<pbrt::Shape>_>_>_>
    ::operator[](in_RSI,(key_type *)in_RDI);
    std::shared_ptr<pbrt::Shape>::operator=
              (in_stack_ffffffffffffff40,(shared_ptr<pbrt::Shape> *)in_stack_ffffffffffffff38);
    peVar2 = std::
             __shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x1dd66e);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&peVar2->attributes);
    _Var6._M_pi = extraout_RDX_00;
    if (bVar1) {
      std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1dd68d);
      peVar3 = std::
               __shared_ptr_access<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x1dd699);
      bVar8 = peVar3->reverseOrientation;
      peVar4 = std::__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1dd6aa);
      peVar4->reverseOrientation = (bool)(bVar8 & 1);
      std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1dd6be);
      std::
      __shared_ptr_access<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                  *)0x1dd6ca);
      bVar1 = std::
              vector<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
              ::empty((vector<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
                       *)CONCAT17(bVar8,in_stack_ffffffffffffff50));
      _Var6._M_pi = extraout_RDX_01;
      if (!bVar1) {
        std::__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<pbrt::syntactic::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1dd6e8);
        peVar3 = std::
                 __shared_ptr_access<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<pbrt::syntactic::Attributes,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1dd6f4);
        local_58 = &peVar3->areaLightSources;
        sVar5 = std::
                vector<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
                ::size(local_58);
        if (1 < sVar5) {
          this_00 = std::operator<<((ostream *)&std::cout,
                                    "Warning: Shape has more than one area light!?");
          std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
        }
        std::
        vector<std::shared_ptr<pbrt::syntactic::AreaLightSource>,_std::allocator<std::shared_ptr<pbrt::syntactic::AreaLightSource>_>_>
        ::operator[](local_58,0);
        this_01 = local_78;
        std::shared_ptr<pbrt::syntactic::AreaLightSource>::shared_ptr
                  ((shared_ptr<pbrt::syntactic::AreaLightSource> *)this_01,
                   (shared_ptr<pbrt::syntactic::AreaLightSource> *)in_stack_ffffffffffffff38);
        parseAreaLight(in_stack_00000128,in_stack_00000120);
        std::__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                  ((__shared_ptr_access<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                   0x1dd7b5);
        std::shared_ptr<pbrt::AreaLight>::operator=
                  (this_01,(shared_ptr<pbrt::AreaLight> *)in_stack_ffffffffffffff38);
        std::shared_ptr<pbrt::AreaLight>::~shared_ptr((shared_ptr<pbrt::AreaLight> *)0x1dd7d0);
        std::shared_ptr<pbrt::syntactic::AreaLightSource>::~shared_ptr
                  ((shared_ptr<pbrt::syntactic::AreaLightSource> *)0x1dd7da);
        _Var6._M_pi = extraout_RDX_02;
      }
    }
  }
  SVar7.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var6._M_pi;
  SVar7.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (SP)SVar7.super___shared_ptr<pbrt::Shape,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Shape::SP SemanticParser::findOrCreateShape(pbrt::syntactic::Shape::SP pbrtShape)
  {
    if (emittedShapes.find(pbrtShape) != emittedShapes.end())
      return emittedShapes[pbrtShape];

    Shape::SP newShape = emitShape(pbrtShape);
    emittedShapes[pbrtShape] = newShape;

    if (pbrtShape->attributes) {
      newShape->reverseOrientation
        = pbrtShape->attributes->reverseOrientation;
      /* now, add area light sources */
      
      if (!pbrtShape->attributes->areaLightSources.empty()) {
        // std::cout << "Shape has " << pbrtShape->attributes->areaLightSources.size()
        //           << " area light sources..." << std::endl;
        auto &areaLights = pbrtShape->attributes->areaLightSources;
        if (areaLights.size() > 1)
          std::cout << "Warning: Shape has more than one area light!?" << std::endl;
        newShape->areaLight = parseAreaLight(areaLights[0]);
      }
    }

    return newShape;
  }